

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void pbrt::PlyErrorCallback(p_ply param_1,char *message)

{
  char *local_8;
  
  local_8 = message;
  Error<char_const*&>("PLY writing error: %s",&local_8);
  return;
}

Assistant:

static void PlyErrorCallback(p_ply, const char *message) {
    Error("PLY writing error: %s", message);
}